

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseQuotedText(WastParser *this,string *text,bool check_utf8)

{
  char *pcVar1;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar2;
  byte bVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  uint uVar7;
  char *pcVar8;
  undefined8 uVar9;
  char cVar10;
  ulong uVar11;
  uint32_t digit;
  Token token;
  uint32_t local_94;
  WastParser *local_90;
  uint local_88 [6];
  Token local_70;
  
  TVar5 = Peek(this,0);
  if (TVar5 == Text) {
    local_90 = this;
    Consume(&local_70,this);
    if (5 < local_70.token_type_ - AlignEqNat) {
      __assert_fail("HasText()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/token.h"
                    ,99,"std::string_view wabt::Token::text() const");
    }
    if (2 < local_70.field_2.text_._M_len) {
      uVar11 = local_70.field_2.text_._M_len - 1;
      if (local_70.field_2.text_._M_len - 2 <= local_70.field_2.text_._M_len - 1) {
        uVar11 = local_70.field_2.text_._M_len - 2;
      }
      if (0 < (long)uVar11) {
        uVar9 = local_70.field_2.text_._M_str;
        do {
          cVar10 = (char)text;
          if (*(char *)(uVar9 + 1) == '\\') {
            bVar3 = *(byte *)(uVar9 + 2);
            if (bVar3 < 0x6e) {
              if (((bVar3 != 0x22) && (bVar3 != 0x27)) && (bVar3 != 0x5c))
              goto switchD_00183b33_caseD_6f;
            }
            else {
              switch(bVar3) {
              case 0x6e:
                break;
              default:
switchD_00183b33_caseD_6f:
                RVar6 = ParseHexdigit(*(char *)(uVar9 + 2),local_88);
                if ((RVar6.enum_ != Ok) ||
                   (RVar6 = ParseHexdigit(*(char *)(uVar9 + 3),&local_94), RVar6.enum_ != Ok)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                ,0x83,
                                "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                uVar9 = uVar9 + 3;
                goto LAB_00183b48;
              case 0x72:
                break;
              case 0x74:
                break;
              case 0x75:
                uVar7 = 0;
                pcVar8 = (char *)(uVar9 + 4);
                do {
                  RVar6 = ParseHexdigit(*pcVar8,local_88);
                  if (RVar6.enum_ != Ok) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                  ,0x5b,
                                  "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                                 );
                  }
                  uVar7 = uVar7 << 4 | local_88[0];
                  uVar9 = pcVar8 + 1;
                  pcVar1 = pcVar8 + 1;
                  pcVar8 = (char *)uVar9;
                } while (*pcVar1 != '}');
                if (0x10ffff < uVar7) {
                  __assert_fail("scalar_value < 0x110000",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                                ,0x61,
                                "void wabt::(anonymous namespace)::RemoveEscapes(std::string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::basic_string<char>>]"
                               );
                }
                if (0x7f < uVar7) {
                  if (0x7ff < uVar7) {
                    if (0xffff < uVar7) {
                      std::__cxx11::string::push_back(cVar10);
                    }
                    std::__cxx11::string::push_back(cVar10);
                  }
                  std::__cxx11::string::push_back(cVar10);
                }
                std::__cxx11::string::push_back(cVar10);
                goto LAB_00183bff;
              }
            }
            std::__cxx11::string::push_back(cVar10);
            uVar9 = (char *)(uVar9 + 2);
          }
          else {
            uVar9 = uVar9 + 1;
LAB_00183b48:
            std::__cxx11::string::push_back(cVar10);
          }
LAB_00183bff:
        } while ((ulong)uVar9 < local_70.field_2.text_._M_str + uVar11);
      }
    }
    if ((check_utf8) &&
       (bVar4 = IsValidUtf8((text->_M_dataplus)._M_p,text->_M_string_length), !bVar4)) {
      Error(local_90,0x1ed700);
    }
    RVar6.enum_ = Ok;
  }
  else {
    paVar2 = &local_70.loc.field_1;
    local_70.loc.filename._M_len = (size_t)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"a quoted string","");
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    local_88[4] = 0;
    local_88[5] = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_88,
               &local_70,&local_70.token_type_);
    RVar6 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_88,"\"foo\"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_88);
    if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_70.loc.filename._M_len != paVar2) {
      operator_delete((void *)local_70.loc.filename._M_len,
                      CONCAT44(local_70.loc.field_1.field_0.first_column,
                               local_70.loc.field_1.field_0.line) + 1);
    }
  }
  return (Result)RVar6.enum_;
}

Assistant:

Result WastParser::ParseQuotedText(std::string* text, bool check_utf8) {
  WABT_TRACE(ParseQuotedText);
  if (!PeekMatch(TokenType::Text)) {
    return ErrorExpected({"a quoted string"}, "\"foo\"");
  }

  Token token = Consume();
  RemoveEscapes(token.text(), std::back_inserter(*text));
  if (check_utf8 && !IsValidUtf8(text->data(), text->length())) {
    Error(token.loc, "quoted string has an invalid utf-8 encoding");
  }
  return Result::Ok;
}